

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string_view full_name,void *parent,string_view name,
          Message *proto,Symbol symbol)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view key;
  string_view v;
  string_view name_00;
  string_view full_name_00;
  string_view element_name_02;
  bool bVar1;
  LogMessage *pLVar2;
  char *pcVar3;
  string_view haystack;
  anon_class_16_2_529cd067 local_198;
  VoidPtr local_188;
  Invoker<std::__cxx11::basic_string<char>_> local_180;
  char *local_178;
  char *local_170;
  anon_class_16_2_15e087ac local_168;
  VoidPtr local_158;
  Invoker<std::__cxx11::basic_string<char>_> local_150;
  char *local_148;
  char *local_140;
  anon_class_8_1_b1a0d8db local_138;
  VoidPtr local_130;
  Invoker<std::__cxx11::basic_string<char>_> local_128;
  char *local_120;
  char *local_118;
  size_type local_110;
  size_type dot_pos;
  char *local_100;
  Symbol local_f8;
  FileDescriptor *local_f0;
  FileDescriptor *other_file;
  char *pcStack_e0;
  LogMessage local_c8;
  Voidify local_b1;
  DescriptorBuilder *local_b0;
  SymbolBase *local_a8;
  size_t local_a0;
  DescriptorBuilder *local_98;
  char *local_90;
  char *local_88;
  anon_class_8_1_b1a0d8db local_80;
  VoidPtr local_78;
  Invoker<std::__cxx11::basic_string<char>_> local_70;
  char *local_68;
  char *local_60;
  lts_20250127 *local_58;
  char *local_50;
  FileDescriptor *local_48;
  void *parent_local;
  DescriptorBuilder *this_local;
  Symbol symbol_local;
  string_view name_local;
  string_view full_name_local;
  
  name_local._M_len = (size_t)name._M_str;
  symbol_local.ptr_ = (SymbolBase *)name._M_len;
  pcVar3 = full_name._M_str;
  local_58 = (lts_20250127 *)full_name._M_len;
  this_local = (DescriptorBuilder *)symbol.ptr_;
  local_48 = (FileDescriptor *)parent;
  if (parent == (void *)0x0) {
    local_48 = this->file_;
  }
  haystack._M_str = (char *)0x0;
  haystack._M_len = (size_t)pcVar3;
  local_50 = pcVar3;
  parent_local = this;
  name_local._M_str = (char *)local_58;
  bVar1 = absl::lts_20250127::StrContains(local_58,haystack,(char)parent);
  if (bVar1) {
    local_68 = name_local._M_str;
    local_80.full_name = (string_view *)&name_local._M_str;
    local_60 = pcVar3;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__0,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_78,&local_80);
    element_name_02._M_str = local_60;
    element_name_02._M_len = (size_t)local_68;
    make_error.invoker_ = local_70;
    make_error.ptr_.obj = local_78.obj;
    AddError(this,element_name_02,proto,NAME,make_error);
    full_name_local._M_str._7_1_ = false;
  }
  else {
    local_90 = name_local._M_str;
    local_98 = this_local;
    full_name_00._M_str = pcVar3;
    full_name_00._M_len = (size_t)name_local._M_str;
    local_88 = pcVar3;
    bVar1 = DescriptorPool::Tables::AddSymbol(this->tables_,full_name_00,(Symbol)this_local);
    if (bVar1) {
      local_a8 = symbol_local.ptr_;
      local_a0 = name_local._M_len;
      local_b0 = this_local;
      name_00._M_str = (char *)name_local._M_len;
      name_00._M_len = (size_t)symbol_local.ptr_;
      bVar1 = FileDescriptorTables::AddAliasUnderParent
                        (this->file_tables_,local_48,name_00,(Symbol)this_local);
      if (bVar1) {
        full_name_local._M_str._7_1_ = true;
      }
      else {
        if ((this->had_errors_ & 1U) == 0) {
          absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                    ((LogMessageDebugFatal *)&local_c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x161a);
          pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c8);
          pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar2,(char (*) [2])0x5f3aeb);
          other_file = (FileDescriptor *)name_local._M_str;
          v._M_str = pcVar3;
          v._M_len = (size_t)name_local._M_str;
          pcStack_e0 = pcVar3;
          pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
          pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar2,(char (*) [113])
                                     "\" not previously defined in symbols_by_name_, but was defined in symbols_by_parent_; this shouldn\'t be possible."
                             );
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_b1,pLVar2);
          absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                    ((LogMessageDebugFatal *)&local_c8);
        }
        full_name_local._M_str._7_1_ = false;
      }
    }
    else {
      dot_pos = (size_type)name_local._M_str;
      key._M_str = pcVar3;
      key._M_len = (size_t)name_local._M_str;
      local_100 = pcVar3;
      local_f8 = DescriptorPool::Tables::FindSymbol(this->tables_,key);
      local_f0 = Symbol::GetFile(&local_f8);
      if (local_f0 == this->file_) {
        local_110 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &name_local._M_str,'.',0xffffffffffffffff);
        if (local_110 == 0xffffffffffffffff) {
          local_120 = name_local._M_str;
          local_138.full_name = (string_view *)&name_local._M_str;
          local_118 = pcVar3;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__1,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_130,&local_138);
          element_name_01._M_str = local_118;
          element_name_01._M_len = (size_t)local_120;
          make_error_00.invoker_ = local_128;
          make_error_00.ptr_.obj = local_130.obj;
          AddError(this,element_name_01,proto,NAME,make_error_00);
        }
        else {
          local_148 = name_local._M_str;
          local_168.full_name = (string_view *)&name_local._M_str;
          local_168.dot_pos = &local_110;
          local_140 = pcVar3;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__2,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_158,&local_168);
          element_name_00._M_str = local_140;
          element_name_00._M_len = (size_t)local_148;
          make_error_01.invoker_ = local_150;
          make_error_01.ptr_.obj = local_158.obj;
          AddError(this,element_name_00,proto,NAME,make_error_01);
        }
      }
      else {
        local_178 = name_local._M_str;
        local_198.full_name = (string_view *)&name_local._M_str;
        local_198.other_file = &local_f0;
        local_170 = pcVar3;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__3,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_188,&local_198);
        element_name._M_str = local_170;
        element_name._M_len = (size_t)local_178;
        make_error_02.invoker_ = local_180;
        make_error_02.ptr_.obj = local_188.obj;
        AddError(this,element_name,proto,NAME,make_error_02);
      }
      full_name_local._M_str._7_1_ = false;
    }
  }
  return full_name_local._M_str._7_1_;
}

Assistant:

bool DescriptorBuilder::AddSymbol(const absl::string_view full_name,
                                  const void* parent,
                                  const absl::string_view name,
                                  const Message& proto, Symbol symbol) {
  // If the caller passed nullptr for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == nullptr) parent = file_;

  if (absl::StrContains(full_name, '\0')) {
    AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", full_name, "\" contains null character.");
    });
    return false;
  }
  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      // This is only possible if there was already an error adding something of
      // the same name.
      if (!had_errors_) {
        ABSL_DLOG(FATAL) << "\"" << full_name
                         << "\" not previously defined in "
                            "symbols_by_name_, but was defined in "
                            "symbols_by_parent_; this shouldn't be possible.";
      }
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      std::string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == std::string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat("\"", full_name, "\" is already defined.");
        });
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat("\"", full_name.substr(dot_pos + 1),
                              "\" is already defined in \"",
                              full_name.substr(0, dot_pos), "\".");
        });
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::StrCat(
            "\"", full_name, "\" is already defined in file \"",
            (other_file == nullptr ? "null" : other_file->name()), "\".");
      });
    }
    return false;
  }
}